

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::HandleTestModelArgument
          (cmCTest *this,char *ctestExec,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  ulong uVar1;
  undefined1 uVar2;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  ostream *poVar6;
  char *pcVar7;
  string local_3f8 [32];
  undefined1 local_3d8 [8];
  ostringstream cmCTestLog_msg_1;
  string local_260 [32];
  undefined1 local_240 [8];
  ostringstream cmCTestLog_msg;
  string local_c8;
  string local_a8;
  string local_88;
  const_reference local_68;
  string *str;
  undefined1 local_50 [8];
  string arg;
  bool success;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  size_t *i_local;
  char *ctestExec_local;
  cmCTest *this_local;
  
  arg.field_2._M_local_buf[0xf] = '\x01';
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,*i);
  std::__cxx11::string::string((string *)local_50,(string *)pvVar4);
  bVar3 = CheckArgument(this,(string *)local_50,"-M","--test-model");
  if ((bVar3) &&
     (uVar1 = *i,
     sVar5 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(args), uVar1 < sVar5 - 1)) {
    *i = *i + 1;
    local_68 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](args,*i);
    cmsys::SystemTools::LowerCase(&local_88,local_68);
    bVar3 = std::operator==(&local_88,"nightly");
    std::__cxx11::string::~string((string *)&local_88);
    if (bVar3) {
      SetTestModel(this,1);
    }
    else {
      cmsys::SystemTools::LowerCase(&local_a8,local_68);
      bVar3 = std::operator==(&local_a8,"continuous");
      std::__cxx11::string::~string((string *)&local_a8);
      if (bVar3) {
        SetTestModel(this,2);
      }
      else {
        cmsys::SystemTools::LowerCase(&local_c8,local_68);
        bVar3 = std::operator==(&local_c8,"experimental");
        std::__cxx11::string::~string((string *)&local_c8);
        if (bVar3) {
          SetTestModel(this,0);
        }
        else {
          arg.field_2._M_local_buf[0xf] = '\0';
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_240);
          poVar6 = std::operator<<((ostream *)local_240,"CTest -M called with incorrect option: ");
          poVar6 = std::operator<<(poVar6,(string *)local_68);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          Log(this,6,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x88c,pcVar7,false);
          std::__cxx11::string::~string(local_260);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_240);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
          poVar6 = std::operator<<((ostream *)local_3d8,"Available options are:");
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(poVar6,"  ");
          poVar6 = std::operator<<(poVar6,ctestExec);
          poVar6 = std::operator<<(poVar6," -M Continuous");
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(poVar6,"  ");
          poVar6 = std::operator<<(poVar6,ctestExec);
          poVar6 = std::operator<<(poVar6," -M Experimental");
          poVar6 = (ostream *)
                   std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          poVar6 = std::operator<<(poVar6,"  ");
          poVar6 = std::operator<<(poVar6,ctestExec);
          poVar6 = std::operator<<(poVar6," -M Nightly");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          std::__cxx11::ostringstream::str();
          pcVar7 = (char *)std::__cxx11::string::c_str();
          Log(this,6,
              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
              ,0x891,pcVar7,false);
          std::__cxx11::string::~string(local_3f8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
        }
      }
    }
  }
  uVar2 = arg.field_2._M_local_buf[0xf];
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(uVar2 & 1);
}

Assistant:

bool cmCTest::HandleTestModelArgument(const char* ctestExec, size_t& i,
                                      const std::vector<std::string>& args)
{
  bool success = true;
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-M", "--test-model") &&
      (i < args.size() - 1)) {
    i++;
    std::string const& str = args[i];
    if (cmSystemTools::LowerCase(str) == "nightly") {
      this->SetTestModel(cmCTest::NIGHTLY);
    } else if (cmSystemTools::LowerCase(str) == "continuous") {
      this->SetTestModel(cmCTest::CONTINUOUS);
    } else if (cmSystemTools::LowerCase(str) == "experimental") {
      this->SetTestModel(cmCTest::EXPERIMENTAL);
    } else {
      success = false;
      cmCTestLog(this, ERROR_MESSAGE, "CTest -M called with incorrect option: "
                   << str << std::endl);
      cmCTestLog(this, ERROR_MESSAGE, "Available options are:"
                   << std::endl
                   << "  " << ctestExec << " -M Continuous" << std::endl
                   << "  " << ctestExec << " -M Experimental" << std::endl
                   << "  " << ctestExec << " -M Nightly" << std::endl);
    }
  }
  return success;
}